

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall pbrt::ZSobolSampler::Get1D(ZSobolSampler *this)

{
  uint32_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  OwenScrambler local_c;
  
  auVar9 = in_ZMM0._0_16_;
  uVar2 = GetSampleIndex(this);
  uVar3 = (ulong)(this->seed ^ this->dimension);
  this->dimension = this->dimension + 1;
  uVar3 = (uVar3 >> 0x1f ^ uVar3) * 0x7fb5d329728ea185;
  lVar6 = (uVar3 >> 0x1b ^ uVar3) * -0x7e25210b43d22bb3;
  local_c.seed = (uint)((ulong)lVar6 >> 0x21) ^ (uint)lVar6;
  switch(this->randomizeStrategy) {
  case None:
    if (uVar2 == 0) {
      auVar9 = ZEXT816(0) << 0x40;
      goto LAB_0033c9fb;
    }
    puVar4 = &SobolMatrices32;
    uVar5 = 0;
    do {
      if ((uVar2 & 1) != 0) {
        uVar5 = uVar5 ^ *puVar4;
      }
      puVar4 = puVar4 + 1;
      bVar7 = 1 < uVar2;
      uVar2 = (long)uVar2 >> 1;
    } while (bVar7);
    auVar9 = vcvtusi2ss_avx512f(auVar9,uVar5);
    fVar8 = auVar9._0_4_;
    break;
  case CranleyPatterson:
    uVar5 = 0;
    if (uVar2 != 0) {
      puVar4 = &SobolMatrices32;
      do {
        if ((uVar2 & 1) != 0) {
          uVar5 = uVar5 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar7 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar7);
    }
    uVar5 = uVar5 + local_c.seed;
    goto LAB_0033c9b0;
  case PermuteDigits:
    uVar5 = 0;
    if (uVar2 != 0) {
      puVar4 = &SobolMatrices32;
      do {
        if ((uVar2 & 1) != 0) {
          uVar5 = uVar5 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar7 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar7);
    }
    uVar5 = uVar5 ^ local_c.seed;
LAB_0033c9b0:
    auVar9 = vcvtusi2ss_avx512f(auVar9,uVar5);
    fVar8 = auVar9._0_4_;
    break;
  case FastOwen:
    if (uVar2 != 0) {
      do {
        bVar7 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar7);
    }
    halt_baddata();
  default:
    uVar5 = 0;
    if (uVar2 != 0) {
      puVar4 = &SobolMatrices32;
      do {
        if ((uVar2 & 1) != 0) {
          uVar5 = uVar5 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar7 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar7);
    }
    uVar1 = OwenScrambler::operator()(&local_c,uVar5);
    auVar9 = vcvtusi2ss_avx512f(in_XMM2,uVar1);
    fVar8 = auVar9._0_4_;
  }
  auVar9 = ZEXT416((uint)(fVar8 * 2.3283064e-10));
LAB_0033c9fb:
  auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
  return auVar9._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t sampleIndex = GetSampleIndex();
        uint32_t sampleHash = MixBits(dimension ^ seed);

        ++dimension;

        if (randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sampleIndex, 0, NoRandomizer());
        else if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return SobolSample(sampleIndex, 0, CranleyPattersonRotator(sampleHash));
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return SobolSample(sampleIndex, 0, BinaryPermuteScrambler(sampleHash));
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return SobolSample(sampleIndex, 0, FastOwenScrambler(sampleHash));
        else
            return SobolSample(sampleIndex, 0, OwenScrambler(sampleHash));
    }